

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-tests.c
# Opt level: O1

int maybe_run_test(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  __uid_t _Var5;
  __gid_t _Var6;
  uint uVar7;
  uint uVar8;
  ssize_t sVar9;
  char *pcVar10;
  int *piVar11;
  char *extraout_RAX;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  undefined4 in_register_0000003c;
  int64_t *piVar16;
  long lVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int64_t eval_b;
  uv_os_fd_t closed_fd;
  uv_os_fd_t open_fd;
  char buffer [256];
  
  lVar17 = CONCAT44(in_register_0000003c,argc);
  pcVar10 = *(char **)(lVar17 + 8);
  iVar4 = strcmp(pcVar10,"--list");
  if (iVar4 == 0) {
    print_tests((FILE *)_stdout);
    return 0;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_listen_before_write");
  if (iVar4 == 0) {
    iVar4 = 0;
LAB_00180771:
    iVar4 = ipc_helper(iVar4);
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_listen_after_write");
  if (iVar4 == 0) {
    iVar4 = 1;
    goto LAB_00180771;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_heavy_traffic_deadlock_bug");
  if (iVar4 == 0) {
    iVar4 = ipc_helper_heavy_traffic_deadlock_bug();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"ipc_send_recv_helper");
  if (iVar4 == 0) {
    iVar4 = ipc_send_recv_helper();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_tcp_connection");
  if (iVar4 == 0) {
    iVar4 = ipc_helper_tcp_connection();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_bind_twice");
  if (iVar4 == 0) {
    iVar4 = ipc_helper_bind_twice();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"ipc_helper_send_zero");
  if (iVar4 == 0) {
    iVar4 = ipc_helper_send_zero();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"stdio_over_pipes_helper");
  if (iVar4 == 0) {
    iVar4 = stdio_over_pipes_helper();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"spawn_helper1");
  if (iVar4 == 0) {
LAB_00180a53:
    notify_parent_process();
    return 1;
  }
  iVar4 = strcmp(pcVar10,"spawn_helper2");
  if (iVar4 == 0) {
    notify_parent_process();
    puts("hello world");
    return 1;
  }
  iVar4 = strcmp(pcVar10,"spawn_tcp_server_helper");
  if (iVar4 == 0) {
    notify_parent_process();
    iVar4 = spawn_tcp_server_helper();
    return iVar4;
  }
  iVar4 = strcmp(pcVar10,"spawn_helper3");
  if (iVar4 == 0) {
    notify_parent_process();
    pcVar10 = buffer;
    pcVar12 = fgets(pcVar10,0xff,_stdin);
    if (pcVar10 == pcVar12) {
      buffer[0xff] = '\0';
      fputs(buffer,_stdout);
      return 1;
    }
LAB_00180bb6:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
            ,0x9c,"buffer","==","fgets(buffer, sizeof(buffer) - 1, stdin)",pcVar10,"==",pcVar12);
    abort();
  }
  iVar4 = strcmp(pcVar10,"spawn_helper4");
  if (iVar4 == 0) {
    notify_parent_process();
    do {
      uv_sleep(10000);
    } while( true );
  }
  iVar4 = strcmp(pcVar10,"spawn_helper5");
  if (iVar4 == 0) {
    notify_parent_process();
    do {
      sVar9 = write(3,"fourth stdio!\n",0xe);
      if (sVar9 != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    fsync(3);
    return 1;
  }
  iVar4 = strcmp(pcVar10,"spawn_helper6");
  if (iVar4 == 0) {
    notify_parent_process();
    iVar4 = fprintf(_stdout,"hello world\n");
    buffer._0_8_ = SEXT48(iVar4);
    eval_b = 0;
    if (0 < (long)buffer._0_8_) {
      maybe_run_test_cold_16();
      return 1;
    }
    maybe_run_test_cold_15();
LAB_00180c11:
    maybe_run_test_cold_14();
LAB_00180c16:
    maybe_run_test_cold_8();
LAB_00180c25:
    maybe_run_test_cold_9();
LAB_00180c34:
    maybe_run_test_cold_10();
LAB_00180c43:
    maybe_run_test_cold_11();
LAB_00180c52:
    maybe_run_test_cold_6();
LAB_00180c61:
    maybe_run_test_cold_7();
LAB_00180c70:
    maybe_run_test_cold_1();
LAB_00180c75:
    maybe_run_test_cold_2();
  }
  else {
    iVar4 = strcmp(pcVar10,"spawn_helper7");
    if (iVar4 == 0) {
      notify_parent_process();
      pcVar10 = getenv("ENV_TEST");
      if (pcVar10 == (char *)0x0) goto LAB_00180c11;
      iVar4 = fprintf(_stdout,"%s",pcVar10);
      buffer._0_8_ = SEXT48(iVar4);
      eval_b = 0;
      if (0 < (long)buffer._0_8_) {
        return 1;
      }
      maybe_run_test_cold_13();
LAB_00180908:
      notify_parent_process();
      buffer[0] = '\x04';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      eval_b = read(0,&closed_fd,4);
      if (buffer._0_8_ != eval_b) goto LAB_00180c16;
      buffer[0] = '\x04';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      eval_b = read(0,&open_fd,4);
      if (buffer._0_8_ != eval_b) goto LAB_00180c25;
      buffer._0_8_ = SEXT48(open_fd);
      eval_b = 2;
      if ((long)buffer._0_8_ < 3) goto LAB_00180c34;
      buffer._0_8_ = SEXT48(closed_fd);
      eval_b = 2;
      if (2 < (long)buffer._0_8_) {
        buffer[0] = -1;
        buffer[1] = -1;
        buffer[2] = -1;
        buffer[3] = -1;
        buffer[4] = -1;
        buffer[5] = -1;
        buffer[6] = -1;
        buffer[7] = -1;
        eval_b = write(closed_fd,"x",1);
        if (buffer._0_8_ == eval_b) {
          return 1;
        }
        maybe_run_test_cold_12();
LAB_001809eb:
        notify_parent_process();
        spawn_stdin_stdout();
        return 1;
      }
      goto LAB_00180c43;
    }
    iVar4 = strcmp(pcVar10,"spawn_helper8");
    if (iVar4 == 0) goto LAB_00180908;
    iVar4 = strcmp(pcVar10,"spawn_helper9");
    if (iVar4 == 0) goto LAB_001809eb;
    iVar4 = strcmp(pcVar10,"spawn_helper_setuid_setgid");
    if (iVar4 == 0) {
      uVar7 = atoi(*(char **)(lVar17 + 0x10));
      uVar8 = atoi(*(char **)(lVar17 + 0x18));
      buffer._0_8_ = ZEXT48(uVar7);
      _Var5 = getuid();
      eval_b = (int64_t)_Var5;
      if (buffer._0_8_ != eval_b) goto LAB_00180c52;
      buffer._0_8_ = ZEXT48(uVar8);
      _Var6 = getgid();
      eval_b = (int64_t)_Var6;
      if (buffer._0_8_ == eval_b) goto LAB_00180a53;
      goto LAB_00180c61;
    }
    iVar4 = strcmp(pcVar10,"spawn_helper_affinity");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar10,"process_title_big_argv_helper");
      if (iVar4 == 0) {
        notify_parent_process();
        process_title_big_argv();
        return 0;
      }
      iVar4 = run_test(pcVar10,0,1);
      return iVar4;
    }
    uVar7 = uv_cpumask_size();
    if ((int)uVar7 < 1) goto LAB_00180c70;
    uVar8 = atoi(*(char **)(lVar17 + 0x10));
    if ((int)uVar8 < 0) goto LAB_00180c75;
    pcVar10 = (char *)(ulong)uVar8;
    if ((int)uVar8 < (int)uVar7) {
      buffer[0x70] = '\0';
      buffer[0x71] = '\0';
      buffer[0x72] = '\0';
      buffer[0x73] = '\0';
      buffer[0x74] = '\0';
      buffer[0x75] = '\0';
      buffer[0x76] = '\0';
      buffer[0x77] = '\0';
      buffer[0x78] = '\0';
      buffer[0x79] = '\0';
      buffer[0x7a] = '\0';
      buffer[0x7b] = '\0';
      buffer[0x7c] = '\0';
      buffer[0x7d] = '\0';
      buffer[0x7e] = '\0';
      buffer[0x7f] = '\0';
      buffer[0x60] = '\0';
      buffer[0x61] = '\0';
      buffer[0x62] = '\0';
      buffer[99] = '\0';
      buffer[100] = '\0';
      buffer[0x65] = '\0';
      buffer[0x66] = '\0';
      buffer[0x67] = '\0';
      buffer[0x68] = '\0';
      buffer[0x69] = '\0';
      buffer[0x6a] = '\0';
      buffer[0x6b] = '\0';
      buffer[0x6c] = '\0';
      buffer[0x6d] = '\0';
      buffer[0x6e] = '\0';
      buffer[0x6f] = '\0';
      buffer[0x50] = '\0';
      buffer[0x51] = '\0';
      buffer[0x52] = '\0';
      buffer[0x53] = '\0';
      buffer[0x54] = '\0';
      buffer[0x55] = '\0';
      buffer[0x56] = '\0';
      buffer[0x57] = '\0';
      buffer[0x58] = '\0';
      buffer[0x59] = '\0';
      buffer[0x5a] = '\0';
      buffer[0x5b] = '\0';
      buffer[0x5c] = '\0';
      buffer[0x5d] = '\0';
      buffer[0x5e] = '\0';
      buffer[0x5f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      lVar17 = 0;
      iVar4 = sched_getaffinity(0,0x80,(cpu_set_t *)buffer);
      if (iVar4 != 0) {
        piVar11 = __errno_location();
        lVar17 = (long)*piVar11;
      }
      _closed_fd = 0;
      eval_b = lVar17;
      if (lVar17 == 0) {
        pcVar12 = (char *)0x1;
        if (1 < (int)uVar7) {
          pcVar12 = (char *)(ulong)uVar7;
        }
        pcVar14 = (char *)0x0;
        while( true ) {
          if (pcVar14 < (char *)0x400) {
            eval_b = (int64_t)((*(ulong *)(buffer + ((ulong)pcVar14 >> 6) * 8) >>
                                ((ulong)pcVar14 & 0x3f) & 1) != 0);
          }
          else {
            eval_b = 0;
          }
          _closed_fd = (ulong)(pcVar10 == pcVar14);
          if (eval_b != _closed_fd) break;
          pcVar14 = pcVar14 + 1;
          if (pcVar12 == pcVar14) {
            return 1;
          }
        }
        maybe_run_test_cold_5();
        pcVar12 = extraout_RAX;
        goto LAB_00180bb6;
      }
      goto LAB_00180c7f;
    }
  }
  maybe_run_test_cold_3();
LAB_00180c7f:
  piVar16 = &eval_b;
  maybe_run_test_cold_4();
  uVar13 = (long)((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - 9.223372036854776e+18) &
           (long)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) >> 0x3f |
           (long)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  *(undefined1 *)((long)piVar16 + 0x1f) = 0;
  if (uVar13 == 0) {
    *(undefined1 *)((long)piVar16 + 0x1e) = 0x30;
    lVar17 = (long)piVar16 + 0x1e;
  }
  else {
    lVar17 = (long)piVar16 + 0x1f;
    while( true ) {
      cVar3 = (char)(uVar13 / 10);
      *(byte *)(lVar17 + -1) = (char)uVar13 + cVar3 * -10 | 0x30;
      if (uVar13 < 10) {
        lVar17 = lVar17 + -1;
        uVar15 = 0;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar13 / 10;
        *(byte *)(lVar17 + -2) = cVar3 + SUB161(auVar1 * ZEXT816(0x199999999999999a),8) * -10 | 0x30
        ;
        lVar17 = lVar17 + -2;
        uVar15 = uVar13 / 100;
      }
      if (uVar15 == 0) {
        uVar13 = 0;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar15;
        uVar13 = uVar15 / 10;
        *(byte *)(lVar17 + -1) =
             (char)uVar15 + SUB161(auVar2 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
        lVar17 = lVar17 + -1;
      }
      if (uVar13 == 0) break;
      *(undefined1 *)(lVar17 + -1) = 0x2c;
      lVar17 = lVar17 + -1;
    }
  }
  return (int)lVar17;
}

Assistant:

static int maybe_run_test(int argc, char **argv) {
  if (strcmp(argv[1], "--list") == 0) {
    print_tests(stdout);
    return 0;
  }

  if (strcmp(argv[1], "ipc_helper_listen_before_write") == 0) {
    return ipc_helper(0);
  }

  if (strcmp(argv[1], "ipc_helper_listen_after_write") == 0) {
    return ipc_helper(1);
  }

  if (strcmp(argv[1], "ipc_helper_heavy_traffic_deadlock_bug") == 0) {
    return ipc_helper_heavy_traffic_deadlock_bug();
  }

  if (strcmp(argv[1], "ipc_send_recv_helper") == 0) {
    return ipc_send_recv_helper();
  }

  if (strcmp(argv[1], "ipc_helper_tcp_connection") == 0) {
    return ipc_helper_tcp_connection();
  }

  if (strcmp(argv[1], "ipc_helper_bind_twice") == 0) {
    return ipc_helper_bind_twice();
  }

  if (strcmp(argv[1], "ipc_helper_send_zero") == 0) {
    return ipc_helper_send_zero();
  }

  if (strcmp(argv[1], "stdio_over_pipes_helper") == 0) {
    return stdio_over_pipes_helper();
  }

  if (strcmp(argv[1], "spawn_helper1") == 0) {
    notify_parent_process();
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper2") == 0) {
    notify_parent_process();
    printf("hello world\n");
    return 1;
  }

  if (strcmp(argv[1], "spawn_tcp_server_helper") == 0) {
    notify_parent_process();
    return spawn_tcp_server_helper();
  }

  if (strcmp(argv[1], "spawn_helper3") == 0) {
    char buffer[256];
    notify_parent_process();
    ASSERT_PTR_EQ(buffer, fgets(buffer, sizeof(buffer) - 1, stdin));
    buffer[sizeof(buffer) - 1] = '\0';
    fputs(buffer, stdout);
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper4") == 0) {
    notify_parent_process();
    /* Never surrender, never return! */
    for (;;) uv_sleep(10000);
  }

  if (strcmp(argv[1], "spawn_helper5") == 0) {
    const char out[] = "fourth stdio!\n";
    notify_parent_process();
    {
#ifdef _WIN32
      DWORD bytes;
      WriteFile((HANDLE) _get_osfhandle(3), out, sizeof(out) - 1, &bytes, NULL);
#else
      ssize_t r;

      do
        r = write(3, out, sizeof(out) - 1);
      while (r == -1 && errno == EINTR);

      fsync(3);
#endif
    }
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper6") == 0) {
    int r;

    notify_parent_process();

    r = fprintf(stdout, "hello world\n");
    ASSERT_GT(r, 0);

    r = fprintf(stderr, "hello errworld\n");
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper7") == 0) {
    int r;
    char *test;

    notify_parent_process();

    /* Test if the test value from the parent is still set */
    test = getenv("ENV_TEST");
    ASSERT_NOT_NULL(test);

    r = fprintf(stdout, "%s", test);
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper8") == 0) {
    uv_os_fd_t closed_fd;
    uv_os_fd_t open_fd;
#ifdef _WIN32
    DWORD flags;
    HMODULE kernelbase_module;
    sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#endif
    notify_parent_process();
    ASSERT_EQ(sizeof(closed_fd), read(0, &closed_fd, sizeof(closed_fd)));
    ASSERT_EQ(sizeof(open_fd), read(0, &open_fd, sizeof(open_fd)));
#ifdef _WIN32
    ASSERT_GT((intptr_t) closed_fd, 0);
    ASSERT_GT((intptr_t) open_fd, 0);
    ASSERT_NE(0, GetHandleInformation(open_fd, &flags));
    kernelbase_module = GetModuleHandleA("kernelbase.dll");
    pCompareObjectHandles = (sCompareObjectHandles)
        GetProcAddress(kernelbase_module, "CompareObjectHandles");
    ASSERT_NE(pCompareObjectHandles == NULL || \
              !pCompareObjectHandles(open_fd, closed_fd), 0);
#else
    ASSERT_GT(open_fd, 2);
    ASSERT_GT(closed_fd, 2);
# if defined(__PASE__)  /* On IBMi PASE, write() returns 1 */
    ASSERT_EQ(1, write(closed_fd, "x", 1));
# else
    ASSERT_EQ(-1, write(closed_fd, "x", 1));
# endif  /* !__PASE__ */
#endif
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper9") == 0) {
    notify_parent_process();
    spawn_stdin_stdout();
    return 1;
  }

#ifndef _WIN32
  if (strcmp(argv[1], "spawn_helper_setuid_setgid") == 0) {
    uv_uid_t uid = atoi(argv[2]);
    uv_gid_t gid = atoi(argv[3]);

    ASSERT_EQ(uid, getuid());
    ASSERT_EQ(gid, getgid());
    notify_parent_process();

    return 1;
  }
#endif  /* !_WIN32 */

#if !defined(NO_CPU_AFFINITY)
  if (strcmp(argv[1], "spawn_helper_affinity") == 0) {
    int i;
    int r;
    int cpu;
    int cpumask_size;
#ifdef _WIN32
    DWORD_PTR procmask;
    DWORD_PTR sysmask;
#elif defined(__linux__)
    cpu_set_t cpuset;
#else
    cpuset_t cpuset;
#endif

    cpumask_size = uv_cpumask_size();
    ASSERT(cpumask_size > 0);

    cpu = atoi(argv[2]);
    ASSERT(cpu >= 0);
    ASSERT(cpu < cpumask_size);

    /* verify the mask has the cpu we expect */
#ifdef _WIN32
    r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
    ASSERT(r != 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT(((procmask & (((DWORD_PTR)1) << i)) != 0) == (i == cpu));
    }
#else
    CPU_ZERO(&cpuset);
#ifdef __linux__
    r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
    if (r)
      r = errno;
    else
      r = 0;
#else
    r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
    ASSERT_EQ(r, 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT_EQ(CPU_ISSET(i, &cpuset), (i == cpu));
    }
#endif

    return 1;
  }
#endif

  if (strcmp(argv[1], "process_title_big_argv_helper") == 0) {
    notify_parent_process();
    process_title_big_argv();
    return 0;
  }

  return run_test(argv[1], 0, 1);
}